

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2DocsSamples.cpp
# Opt level: O2

string * __thiscall
Greeting::getGreetingFor_abi_cxx11_
          (string *__return_storage_ptr__,Greeting *this,Nationality aNationality)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (aNationality == French) {
    __s = "Bonjour";
    __a = &local_b;
  }
  else if (aNationality == American) {
    __s = "Howdy";
    __a = &local_a;
  }
  else if (aNationality == British) {
    __s = "Cheers";
    __a = &local_9;
  }
  else {
    __s = "Unknown";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getGreetingFor(Nationality aNationality) const
    {
        switch (aNationality)
        {
        case British:
            return "Cheers";
        case American:
            return "Howdy";
        case French:
            return "Bonjour";
        default:
            return "Unknown";
        }
    }